

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

void __thiscall Centaurus::ATNPath::parse(ATNPath *this,Stream *stream)

{
  wchar_t *pwVar1;
  bool bVar2;
  wchar_t wVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  StreamException *pSVar7;
  int index;
  wstring index_str;
  Identifier id;
  int local_84;
  wchar_t *local_80;
  undefined8 local_78;
  wchar_t local_70 [4];
  wchar_t *local_60;
  Identifier local_58;
  
  while( true ) {
    Identifier::Identifier(&local_58,stream);
    wVar3 = Stream::get(stream);
    if (wVar3 != L'.') {
      pSVar7 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar7,stream,wVar3);
      __cxa_throw(pSVar7,&StreamException::typeinfo,StreamException::~StreamException);
    }
    local_78 = 0;
    local_70[0] = L'\0';
    local_80 = local_70;
    wVar3 = Stream::get(stream);
    iVar4 = iswdigit(wVar3);
    if (iVar4 == 0) {
      pSVar7 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar7,stream,wVar3);
      __cxa_throw(pSVar7,&StreamException::typeinfo,StreamException::~StreamException);
    }
    std::__cxx11::wstring::push_back((wchar_t)&local_80);
    while( true ) {
      pwVar1 = (stream->m_cur)._M_current;
      if (pwVar1 == (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
        wVar3 = L'\0';
      }
      else {
        wVar3 = *pwVar1;
      }
      iVar4 = iswdigit(wVar3);
      pwVar1 = local_80;
      if (iVar4 == 0) break;
      std::__cxx11::wstring::push_back((wchar_t)&local_80);
      Stream::get(stream);
    }
    piVar5 = __errno_location();
    iVar4 = *piVar5;
    *piVar5 = 0;
    lVar6 = wcstol(pwVar1,&local_60,10);
    if (local_60 == pwVar1) break;
    if (((int)lVar6 != lVar6) || (*piVar5 == 0x22)) {
      std::__throw_out_of_range("stoi");
    }
    if (*piVar5 == 0) {
      *piVar5 = iVar4;
    }
    local_84 = (int)lVar6;
    std::
    vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>
    ::emplace_back<Centaurus::Identifier&,int&>
              ((vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>
                *)&this->
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ,&local_58,&local_84);
    wVar3 = Stream::get(stream);
    if (wVar3 == L'\0') {
      bVar2 = false;
    }
    else {
      piVar5 = (int *)(ulong)(uint)wVar3;
      if (wVar3 != L'/') goto LAB_0015d871;
      bVar2 = true;
    }
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    local_58._vptr_Identifier = (_func_int **)&PTR__Identifier_001beae0;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_58.m_id._M_dataplus._M_p != &local_58.m_id.field_2) {
      operator_delete(local_58.m_id._M_dataplus._M_p);
    }
    if (!bVar2) {
      return;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0015d871:
  pSVar7 = (StreamException *)__cxa_allocate_exception(0x28);
  Stream::unexpected(pSVar7,stream,(wchar_t)piVar5);
  __cxa_throw(pSVar7,&StreamException::typeinfo,StreamException::~StreamException);
}

Assistant:

void ATNPath::parse(Stream& stream)
{
    while (true)
    {
        Identifier id(stream);

        wchar_t ch = stream.get();
        if (ch != L'.')
            throw stream.unexpected(ch);

        std::wstring index_str;
        ch = stream.get();
        if (!iswdigit(ch))
            throw stream.unexpected(ch);

        index_str.push_back(ch);

        for (ch = stream.peek(); iswdigit(ch); ch = stream.peek())
        {
            index_str.push_back(ch);
            stream.discard();
        }

        int index = std::stoi(index_str);

        emplace_back(id, index);

        ch = stream.get();
        if (ch == L'\0')
            break;
        else if (ch != L'/')
            throw stream.unexpected(ch);
    }
}